

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::noteDefaultClocking
          (Compilation *this,ASTContext *context,DefaultClockingReferenceSyntax *syntax)

{
  SourceRange sourceRange;
  Scope *pSVar1;
  Symbol *pSVar2;
  ASTContext *in_RDI;
  string_view sVar3;
  SourceRange SVar4;
  LookupLocation LVar5;
  Diagnostic *diag;
  Symbol *sym;
  SourceRange range;
  string_view name;
  Scope *in_stack_00000248;
  bitmask<slang::ast::LookupFlags> in_stack_00000254;
  LookupLocation in_stack_00000258;
  string_view in_stack_00000268;
  SourceRange in_stack_00000290;
  ASTContext *in_stack_ffffffffffffff00;
  SourceLocation this_00;
  SourceLocation in_stack_ffffffffffffff08;
  Token *in_stack_ffffffffffffff10;
  DiagCode noteCode;
  SourceLocation in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  DiagCode code;
  bitmask<slang::ast::LookupFlags> local_8c;
  SourceLocation local_88;
  SourceLocation local_80;
  Symbol *local_78;
  uint32_t local_70;
  Symbol *clocking;
  uint32_t uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  Compilation *this_01;
  SourceLocation SVar7;
  SourceLocation in_stack_ffffffffffffffb8;
  SourceLocation local_38;
  SourceLocation local_30;
  Compilation *local_28;
  SourceLocation SStack_20;
  
  code = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  sVar3 = parsing::Token::valueText(in_stack_ffffffffffffff10);
  SVar4 = parsing::Token::range((Token *)in_stack_ffffffffffffff20);
  pSVar1 = not_null<const_slang::ast::Scope_*>::operator*
                     ((not_null<const_slang::ast::Scope_*> *)0x1187e4d);
  noteCode = SUB84((ulong)pSVar1 >> 0x20,0);
  local_28 = (Compilation *)sVar3._M_len;
  SStack_20 = (SourceLocation)sVar3._M_str;
  this_01 = local_28;
  SVar7 = SStack_20;
  LVar5 = ASTContext::getLocation(in_stack_ffffffffffffff00);
  local_78 = (Symbol *)LVar5.scope;
  local_70 = LVar5.index;
  local_38 = SVar4.startLoc;
  local_88 = local_38;
  local_30 = SVar4.endLoc;
  local_80 = local_30;
  clocking = local_78;
  uVar6 = local_70;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_8c,None);
  this_00 = local_80;
  pSVar2 = Lookup::unqualifiedAt
                     (in_stack_00000248,in_stack_00000268,in_stack_00000258,in_stack_00000290,
                      in_stack_00000254);
  if (pSVar2 != (Symbol *)0x0) {
    if (pSVar2->kind == ClockingBlock) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x1187fe7);
      SVar4.endLoc = in_stack_ffffffffffffffb8;
      SVar4.startLoc = SVar7;
      noteDefaultClocking(this_01,(Scope *)CONCAT44(in_stack_ffffffffffffffa4,uVar6),clocking,SVar4)
      ;
    }
    else {
      sourceRange.endLoc = in_stack_ffffffffffffff28;
      sourceRange.startLoc = in_stack_ffffffffffffff20;
      ASTContext::addDiag(in_RDI,code,sourceRange);
      sVar3._M_str = (char *)local_38;
      sVar3._M_len = (size_t)SStack_20;
      Diagnostic::operator<<((Diagnostic *)local_28,sVar3);
      Diagnostic::addNote((Diagnostic *)this_00,noteCode,in_stack_ffffffffffffff08);
    }
  }
  return;
}

Assistant:

void Compilation::noteDefaultClocking(const ASTContext& context,
                                      const DefaultClockingReferenceSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto name = syntax.name.valueText();
    auto range = syntax.name.range();
    auto sym = Lookup::unqualifiedAt(*context.scope, name, context.getLocation(), range);
    if (!sym)
        return;

    if (sym->kind != SymbolKind::ClockingBlock) {
        auto& diag = context.addDiag(diag::NotAClockingBlock, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, sym->location);
        return;
    }

    noteDefaultClocking(*context.scope, *sym, range);
}